

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O0

spv_result_t spvtools::val::ValidateInterfaces(ValidationState_t *_)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  spv_result_t sVar4;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *pvVar5;
  spv_const_context psVar6;
  reference pIVar7;
  spv_result_t error_2;
  spv_result_t error_1;
  Instruction *inst_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *__range3;
  spv_result_t error;
  Instruction *inst;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *__range2;
  bool is_spv_1_4;
  ValidationState_t *__local;
  
  uVar2 = ValidationState_t::version(_);
  pvVar5 = ValidationState_t::ordered_instructions(_);
  __end2 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
           begin(pvVar5);
  inst = (Instruction *)
         std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::end
                   (pvVar5);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                                     *)&inst), bVar1) {
    pIVar7 = __gnu_cxx::
             __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
             ::operator*(&__end2);
    bVar1 = anon_unknown_0::is_interface_variable(pIVar7,0x103ff < uVar2);
    if ((bVar1) &&
       (sVar4 = anon_unknown_0::check_interface_variable(_,pIVar7), sVar4 != SPV_SUCCESS)) {
      return sVar4;
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
    ::operator++(&__end2);
  }
  psVar6 = ValidationState_t::context(_);
  bVar1 = spvIsVulkanEnv(psVar6->target_env);
  if (bVar1) {
    pvVar5 = ValidationState_t::ordered_instructions(_);
    __end3 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
             begin(pvVar5);
    inst_1 = (Instruction *)
             std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
             end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                                       *)&inst_1), bVar1) {
      pIVar7 = __gnu_cxx::
               __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
               ::operator*(&__end3);
      OVar3 = Instruction::opcode(pIVar7);
      if (OVar3 == OpEntryPoint) {
        sVar4 = anon_unknown_0::ValidateLocations(_,pIVar7);
        if (sVar4 != SPV_SUCCESS) {
          return sVar4;
        }
        sVar4 = anon_unknown_0::ValidateStorageClass(_,pIVar7);
        if (sVar4 != SPV_SUCCESS) {
          return sVar4;
        }
      }
      OVar3 = Instruction::opcode(pIVar7);
      if (OVar3 == OpTypeVoid) {
        return SPV_SUCCESS;
      }
      __gnu_cxx::
      __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
      ::operator++(&__end3);
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateInterfaces(ValidationState_t& _) {
  bool is_spv_1_4 = _.version() >= SPV_SPIRV_VERSION_WORD(1, 4);
  for (auto& inst : _.ordered_instructions()) {
    if (is_interface_variable(&inst, is_spv_1_4)) {
      if (auto error = check_interface_variable(_, &inst)) {
        return error;
      }
    }
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    for (auto& inst : _.ordered_instructions()) {
      if (inst.opcode() == spv::Op::OpEntryPoint) {
        if (auto error = ValidateLocations(_, &inst)) {
          return error;
        }
        if (auto error = ValidateStorageClass(_, &inst)) {
          return error;
        }
      }
      if (inst.opcode() == spv::Op::OpTypeVoid) break;
    }
  }

  return SPV_SUCCESS;
}